

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O2

int EncodeAlphaInternal(uint8_t *data,int width,int height,int method,int filter,int reduce_levels,
                       int effort_level,uint8_t *tmp_alpha,FilterTrial *result)

{
  VP8BitWriter *bw;
  int iVar1;
  WebPEncodingError WVar2;
  uint uVar3;
  uint8_t *data_00;
  byte bVar4;
  byte bVar5;
  uint8_t *size;
  uint8_t *puVar6;
  bool bVar7;
  char cVar8;
  char cVar9;
  VP8LBitWriter tmp_bw;
  WebPPicture local_1a8;
  WebPConfig config;
  
  cVar9 = (char)filter;
  if (WebPFilters[filter] != (WebPFilterFunc)0x0) {
    (*WebPFilters[filter])(data,width,height,width,tmp_alpha);
    data = tmp_alpha;
  }
  puVar6 = (uint8_t *)(long)(height * width);
  if (method == 0) {
    cVar8 = '\x01';
    bVar7 = false;
    data_00 = data;
    size = puVar6;
LAB_00128e9d:
    bVar4 = bVar7 + cVar9 * '\x04';
    bVar5 = bVar4 | 0x10;
    if (reduce_levels == 0) {
      bVar5 = bVar4;
    }
    local_1a8.use_argb = CONCAT31(local_1a8.use_argb._1_3_,bVar5);
    bw = &result->bw;
    VP8BitWriterInit(bw,(size_t)(size + 1));
    iVar1 = VP8BitWriterAppend(bw,(uint8_t *)&local_1a8,1);
    if (iVar1 == 0) {
      bVar7 = false;
    }
    else {
      iVar1 = VP8BitWriterAppend(bw,data_00,(size_t)size);
      bVar7 = iVar1 != 0;
    }
    if (cVar8 == '\0') {
      VP8LBitWriterWipeOut(&tmp_bw);
    }
    uVar3 = 0;
    if (bVar7) {
      uVar3 = (uint)((result->bw).error_ == 0);
    }
    result->score = (result->bw).pos_;
  }
  else {
    iVar1 = VP8LBitWriterInit(&tmp_bw,(ulong)puVar6 >> 3);
    if (iVar1 != 0) {
      cVar8 = '\x01';
      WebPPictureInitInternal(&local_1a8,0x20f);
      local_1a8.use_argb = 1;
      local_1a8.width = width;
      local_1a8.height = height;
      local_1a8.stats = &result->stats;
      iVar1 = WebPPictureAlloc(&local_1a8);
      if (iVar1 != 0) {
        (*WebPDispatchAlphaToGreen)
                  (data,width,local_1a8.width,local_1a8.height,local_1a8.argb,local_1a8.argb_stride)
        ;
        WebPConfigInitInternal(&config,WEBP_PRESET_DEFAULT,75.0,0x20f);
        config.lossless = 1;
        config.method = effort_level;
        if (effort_level == 6 && reduce_levels == 0) {
          config.quality = 100.0;
        }
        else {
          config.quality = (float)effort_level * 8.0;
        }
        config.exact = config.lossless;
        WVar2 = VP8LEncodeStream(&config,&local_1a8,&tmp_bw,0);
        WebPPictureFree(&local_1a8);
        if (WVar2 == VP8_ENC_OK && tmp_bw.error_ == 0) {
          data_00 = VP8LBitWriterFinish(&tmp_bw);
          size = tmp_bw.cur_ + ((long)(tmp_bw.used_ + 7 >> 3) - (long)tmp_bw.buf_);
          bVar7 = size <= puVar6;
          if (bVar7) {
            cVar8 = '\0';
          }
          else {
            VP8LBitWriterWipeOut(&tmp_bw);
            data_00 = data;
            size = puVar6;
          }
          goto LAB_00128e9d;
        }
        VP8LBitWriterWipeOut(&tmp_bw);
      }
    }
    VP8LBitWriterWipeOut(&tmp_bw);
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

static int EncodeAlphaInternal(const uint8_t* const data, int width, int height,
                               int method, int filter, int reduce_levels,
                               int effort_level,  // in [0..6] range
                               uint8_t* const tmp_alpha,
                               FilterTrial* result) {
  int ok = 0;
  const uint8_t* alpha_src;
  WebPFilterFunc filter_func;
  uint8_t header;
  const size_t data_size = width * height;
  const uint8_t* output = NULL;
  size_t output_size = 0;
  VP8LBitWriter tmp_bw;

  assert((uint64_t)data_size == (uint64_t)width * height);  // as per spec
  assert(filter >= 0 && filter < WEBP_FILTER_LAST);
  assert(method >= ALPHA_NO_COMPRESSION);
  assert(method <= ALPHA_LOSSLESS_COMPRESSION);
  assert(sizeof(header) == ALPHA_HEADER_LEN);

  filter_func = WebPFilters[filter];
  if (filter_func != NULL) {
    filter_func(data, width, height, width, tmp_alpha);
    alpha_src = tmp_alpha;
  }  else {
    alpha_src = data;
  }

  if (method != ALPHA_NO_COMPRESSION) {
    ok = VP8LBitWriterInit(&tmp_bw, data_size >> 3);
    ok = ok && EncodeLossless(alpha_src, width, height, effort_level,
                              !reduce_levels, &tmp_bw, &result->stats);
    if (ok) {
      output = VP8LBitWriterFinish(&tmp_bw);
      output_size = VP8LBitWriterNumBytes(&tmp_bw);
      if (output_size > data_size) {
        // compressed size is larger than source! Revert to uncompressed mode.
        method = ALPHA_NO_COMPRESSION;
        VP8LBitWriterWipeOut(&tmp_bw);
      }
    } else {
      VP8LBitWriterWipeOut(&tmp_bw);
      return 0;
    }
  }

  if (method == ALPHA_NO_COMPRESSION) {
    output = alpha_src;
    output_size = data_size;
    ok = 1;
  }

  // Emit final result.
  header = method | (filter << 2);
  if (reduce_levels) header |= ALPHA_PREPROCESSED_LEVELS << 4;

  VP8BitWriterInit(&result->bw, ALPHA_HEADER_LEN + output_size);
  ok = ok && VP8BitWriterAppend(&result->bw, &header, ALPHA_HEADER_LEN);
  ok = ok && VP8BitWriterAppend(&result->bw, output, output_size);

  if (method != ALPHA_NO_COMPRESSION) {
    VP8LBitWriterWipeOut(&tmp_bw);
  }
  ok = ok && !result->bw.error_;
  result->score = VP8BitWriterSize(&result->bw);
  return ok;
}